

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O0

int mbedtls_xtea_crypt_ecb(mbedtls_xtea_context *ctx,int mode,uchar *input,uchar *output)

{
  uint local_4c;
  uint32_t sum_1;
  uint32_t delta_1;
  uint32_t delta;
  uint32_t sum;
  uint32_t i;
  uint32_t v1;
  uint32_t v0;
  uint32_t *k;
  uchar *output_local;
  uchar *input_local;
  int mode_local;
  mbedtls_xtea_context *ctx_local;
  
  i = (uint)*input << 0x18 | (uint)input[1] << 0x10 | (uint)input[2] << 8 | (uint)input[3];
  sum = (uint)input[4] << 0x18 | (uint)input[5] << 0x10 | (uint)input[6] << 8 | (uint)input[7];
  if (mode == 1) {
    delta_1 = 0;
    for (delta = 0; delta < 0x20; delta = delta + 1) {
      i = ((sum << 4 ^ sum >> 5) + sum ^ delta_1 + ctx->k[delta_1 & 3]) + i;
      delta_1 = delta_1 + 0x9e3779b9;
      sum = ((i * 0x10 ^ i >> 5) + i ^ delta_1 + ctx->k[delta_1 >> 0xb & 3]) + sum;
    }
  }
  else {
    local_4c = 0xc6ef3720;
    for (delta = 0; delta < 0x20; delta = delta + 1) {
      sum = sum - ((i << 4 ^ i >> 5) + i ^ local_4c + ctx->k[local_4c >> 0xb & 3]);
      local_4c = local_4c + 0x61c88647;
      i = i - ((sum * 0x10 ^ sum >> 5) + sum ^ local_4c + ctx->k[local_4c & 3]);
    }
  }
  *output = (uchar)(i >> 0x18);
  output[1] = (uchar)(i >> 0x10);
  output[2] = (uchar)(i >> 8);
  output[3] = (uchar)i;
  output[4] = (uchar)(sum >> 0x18);
  output[5] = (uchar)(sum >> 0x10);
  output[6] = (uchar)(sum >> 8);
  output[7] = (uchar)sum;
  return 0;
}

Assistant:

int mbedtls_xtea_crypt_ecb( mbedtls_xtea_context *ctx, int mode,
                    const unsigned char input[8], unsigned char output[8])
{
    uint32_t *k, v0, v1, i;

    k = ctx->k;

    GET_UINT32_BE( v0, input, 0 );
    GET_UINT32_BE( v1, input, 4 );

    if( mode == MBEDTLS_XTEA_ENCRYPT )
    {
        uint32_t sum = 0, delta = 0x9E3779B9;

        for( i = 0; i < 32; i++ )
        {
            v0 += (((v1 << 4) ^ (v1 >> 5)) + v1) ^ (sum + k[sum & 3]);
            sum += delta;
            v1 += (((v0 << 4) ^ (v0 >> 5)) + v0) ^ (sum + k[(sum>>11) & 3]);
        }
    }
    else /* MBEDTLS_XTEA_DECRYPT */
    {
        uint32_t delta = 0x9E3779B9, sum = delta * 32;

        for( i = 0; i < 32; i++ )
        {
            v1 -= (((v0 << 4) ^ (v0 >> 5)) + v0) ^ (sum + k[(sum>>11) & 3]);
            sum -= delta;
            v0 -= (((v1 << 4) ^ (v1 >> 5)) + v1) ^ (sum + k[sum & 3]);
        }
    }

    PUT_UINT32_BE( v0, output, 0 );
    PUT_UINT32_BE( v1, output, 4 );

    return( 0 );
}